

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O1

uint8_t * ptls_encode_quicint(uint8_t *p,uint64_t v)

{
  uint8_t *in_RAX;
  
  if (0x3f < v) {
    if (v < 0x4000) {
      *p = (byte)(v >> 8) | 0x40;
      p = p + 1;
    }
    else {
      ptls_encode_quicint_cold_1();
      p = in_RAX;
    }
  }
  *p = (uint8_t)v;
  return p + 1;
}

Assistant:

inline uint8_t *ptls_encode_quicint(uint8_t *p, uint64_t v)
{
    if (PTLS_UNLIKELY(v > 63)) {
        if (PTLS_UNLIKELY(v > 16383)) {
            unsigned sb;
            if (PTLS_UNLIKELY(v > 1073741823)) {
                assert(v <= 4611686018427387903);
                *p++ = 0xc0 | (uint8_t)(v >> 56);
                sb = 6 * 8;
            } else {
                *p++ = 0x80 | (uint8_t)(v >> 24);
                sb = 2 * 8;
            }
            do {
                *p++ = (uint8_t)(v >> sb);
            } while ((sb -= 8) != 0);
        } else {
            *p++ = 0x40 | (uint8_t)((uint16_t)v >> 8);
        }
    }
    *p++ = (uint8_t)v;
    return p;
}